

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.cc
# Opt level: O1

void __thiscall
kratos::DebugDatabase::save_database(DebugDatabase *this,string *filename,bool override)

{
  __node_base_ptr *__return_storage_ptr__;
  vector<std::variant<hgdb::json::Variable,_unsigned_long>,_std::allocator<std::variant<hgdb::json::Variable,_unsigned_long>_>_>
  *this_00;
  Module *this_01;
  _Hash_node_base *p_Var1;
  pointer pcVar2;
  _func_int **pp_Var3;
  __node_base_ptr p_Var4;
  pointer puVar5;
  bool bVar6;
  mapped_type *ppMVar7;
  long *plVar8;
  mapped_type *pmVar9;
  _Base_ptr p_Var10;
  _func_int **pp_Var11;
  long *plVar12;
  __hash_code __code;
  _Rb_tree_header *p_Var13;
  undefined7 in_register_00000011;
  Generator *top;
  Generator *extraout_RDX;
  Generator *extraout_RDX_00;
  ulong uVar14;
  __node_base_ptr p_Var15;
  long *plVar16;
  _func_int **pp_Var17;
  long *plVar18;
  unique_ptr<hgdb::json::Module,_std::default_delete<hgdb::json::Module>_> *m;
  pointer pcVar19;
  pointer puVar20;
  shared_ptr<kratos::Generator> *child;
  undefined1 local_428 [8];
  unordered_map<const_kratos::Stmt_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<const_kratos::Stmt_*>,_std::equal_to<const_kratos::Stmt_*>,_std::allocator<std::pair<const_kratos::Stmt_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  breakpoint_conditions;
  ofstream stream;
  undefined4 uStack_3e4;
  _Hashtable<kratos::IRNode_*,_kratos::IRNode_*,_std::allocator<kratos::IRNode_*>,_std::__detail::_Identity,_std::equal_to<kratos::IRNode_*>,_std::hash<kratos::IRNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_3e0;
  mapped_type local_3a8;
  Generator *local_3a0;
  _Hashtable<const_kratos::Stmt_*,_std::pair<const_kratos::Stmt_*const,_hgdb::json::Scope<std::nullptr_t>_*>,_std::allocator<std::pair<const_kratos::Stmt_*const,_hgdb::json::Scope<std::nullptr_t>_*>_>,_std::__detail::_Select1st,_std::equal_to<const_kratos::Stmt_*>,_std::hash<const_kratos::Stmt_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_398;
  pointer local_360;
  undefined1 *local_358;
  ios_base local_2f8 [264];
  undefined1 local_1f0 [8];
  SymbolTable table;
  long local_158 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_148 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_138;
  _Hash_node_base *local_128;
  _Hash_node_base *p_Stack_120;
  _Hash_node_base *local_118;
  undefined1 local_110 [8];
  unordered_map<kratos::Generator_*,_hgdb::json::Module_*,_std::hash<kratos::Generator_*>,_std::equal_to<kratos::Generator_*>,_std::allocator<std::pair<kratos::Generator_*const,_hgdb::json::Module_*>_>_>
  gen_mod_map;
  __node_base local_c8;
  size_type sStack_c0;
  _Rb_tree_node_base *local_b8;
  long *local_b0;
  _Map_base<const_kratos::Generator_*,_std::pair<const_kratos::Generator_*const,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::pair<const_kratos::Generator_*const,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_kratos::Generator_*>,_std::hash<const_kratos::Generator_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *local_a8;
  string *local_a0;
  undefined1 local_98 [8];
  unordered_set<kratos::Generator_*,_std::hash<kratos::Generator_*>,_std::equal_to<kratos::Generator_*>,_std::allocator<kratos::Generator_*>_>
  visited_gens;
  undefined1 local_58 [8];
  Generator *gen_2;
  undefined8 local_48;
  pointer local_38;
  
  top = (Generator *)CONCAT71(in_register_00000011,override);
  local_38 = (pointer)this;
  if (((int)top != 0) && (bVar6 = fs::exists(filename), top = extraout_RDX, bVar6)) {
    fs::remove((char *)filename);
    top = extraout_RDX_00;
  }
  compute_enable_condition_abi_cxx11_
            ((unordered_map<const_kratos::Stmt_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<const_kratos::Stmt_*>,_std::equal_to<const_kratos::Stmt_*>,_std::allocator<std::pair<const_kratos::Stmt_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_428,*(kratos **)&local_38[5].second,top);
  gen_mod_map._M_h._M_single_bucket = &local_c8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&gen_mod_map._M_h._M_single_bucket,"kratos","");
  local_1f0 = (undefined1  [8])&table.framework_name_._M_string_length;
  if (gen_mod_map._M_h._M_single_bucket == &local_c8) {
    table.framework_name_.field_2._M_allocated_capacity = sStack_c0;
  }
  else {
    local_1f0 = (undefined1  [8])gen_mod_map._M_h._M_single_bucket;
  }
  table.framework_name_._M_string_length = CONCAT71(local_c8._M_nxt._1_7_,local_c8._M_nxt._0_1_);
  table.top_names_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)&table.top_names_;
  local_c8._M_nxt._0_1_ = 0;
  table.top_names_._M_t._M_impl._0_4_ = 0;
  table.top_names_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  table.top_names_._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  table.top_names_._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  table.top_names_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  table.modules_.
  super__Vector_base<std::unique_ptr<hgdb::json::Module,_std::default_delete<hgdb::json::Module>_>,_std::allocator<std::unique_ptr<hgdb::json::Module,_std::default_delete<hgdb::json::Module>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  table.modules_.
  super__Vector_base<std::unique_ptr<hgdb::json::Module,_std::default_delete<hgdb::json::Module>_>,_std::allocator<std::unique_ptr<hgdb::json::Module,_std::default_delete<hgdb::json::Module>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  table.modules_.
  super__Vector_base<std::unique_ptr<hgdb::json::Module,_std::default_delete<hgdb::json::Module>_>,_std::allocator<std::unique_ptr<hgdb::json::Module,_std::default_delete<hgdb::json::Module>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  table.variables_.super__Vector_base<hgdb::json::Variable,_std::allocator<hgdb::json::Variable>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  table.variables_.super__Vector_base<hgdb::json::Variable,_std::allocator<hgdb::json::Variable>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  table.variables_.super__Vector_base<hgdb::json::Variable,_std::allocator<hgdb::json::Variable>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 1;
  local_110 = (undefined1  [8])&gen_mod_map._M_h._M_rehash_policy._M_next_resize;
  gen_mod_map._M_h._M_buckets = (__buckets_ptr)0x1;
  gen_mod_map._M_h._M_bucket_count = 0;
  gen_mod_map._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  gen_mod_map._M_h._M_element_count._0_4_ = 0x3f800000;
  gen_mod_map._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  gen_mod_map._M_h._M_rehash_policy._4_4_ = 0;
  gen_mod_map._M_h._M_rehash_policy._M_next_resize = 0;
  plVar18 = *(long **)&local_38[4].second;
  table.top_names_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       table.top_names_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  gen_mod_map._M_h._M_single_bucket = &local_c8;
  local_a0 = filename;
  if (plVar18 != (long *)0x0) {
    do {
      breakpoint_conditions._M_h._M_single_bucket = (__node_base_ptr)plVar18[1];
      local_98 = (undefined1  [8])
                 hgdb::json::SymbolTable::add_module
                           ((SymbolTable *)local_1f0,
                            (string *)(breakpoint_conditions._M_h._M_single_bucket + 0xf));
      std::
      _Hashtable<kratos::Generator*,std::pair<kratos::Generator*const,hgdb::json::Module*>,std::allocator<std::pair<kratos::Generator*const,hgdb::json::Module*>>,std::__detail::_Select1st,std::equal_to<kratos::Generator*>,std::hash<kratos::Generator*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
      ::_M_emplace<kratos::Generator*&,hgdb::json::Module*&>
                ((_Hashtable<kratos::Generator*,std::pair<kratos::Generator*const,hgdb::json::Module*>,std::allocator<std::pair<kratos::Generator*const,hgdb::json::Module*>>,std::__detail::_Select1st,std::equal_to<kratos::Generator*>,std::hash<kratos::Generator*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                  *)local_110,&breakpoint_conditions._M_h._M_single_bucket,local_98);
      plVar18 = (long *)*plVar18;
    } while (plVar18 != (long *)0x0);
  }
  plVar18 = *(long **)&local_38[4].second;
  if (plVar18 != (long *)0x0) {
    __return_storage_ptr__ = &breakpoint_conditions._M_h._M_single_bucket;
    do {
      local_98 = (undefined1  [8])plVar18[1];
      ppMVar7 = std::__detail::
                _Map_base<kratos::Generator_*,_std::pair<kratos::Generator_*const,_hgdb::json::Module_*>,_std::allocator<std::pair<kratos::Generator_*const,_hgdb::json::Module_*>_>,_std::__detail::_Select1st,_std::equal_to<kratos::Generator_*>,_std::hash<kratos::Generator_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::at((_Map_base<kratos::Generator_*,_std::pair<kratos::Generator_*const,_hgdb::json::Module_*>,_std::allocator<std::pair<kratos::Generator_*const,_hgdb::json::Module_*>_>,_std::__detail::_Select1st,_std::equal_to<kratos::Generator_*>,_std::hash<kratos::Generator_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                      *)local_110,(key_type *)local_98);
      this_01 = *ppMVar7;
      Generator::get_child_generators
                ((vector<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
                  *)__return_storage_ptr__,(Generator *)local_98);
      p_Var4 = (__node_base_ptr)CONCAT44(uStack_3e4,_stream);
      for (p_Var15 = breakpoint_conditions._M_h._M_single_bucket; p_Var15 != p_Var4;
          p_Var15 = p_Var15 + 2) {
        p_Var1 = p_Var15->_M_nxt;
        plVar12 = *(long **)((long)local_110 +
                            ((ulong)p_Var1 % (ulong)gen_mod_map._M_h._M_buckets) * 8);
        plVar8 = (long *)0x0;
        if ((plVar12 != (long *)0x0) &&
           (plVar8 = plVar12, plVar16 = (long *)*plVar12,
           p_Var1 != (_Hash_node_base *)((long *)*plVar12)[1])) {
          while (plVar12 = (long *)*plVar16, plVar12 != (long *)0x0) {
            plVar8 = (long *)0x0;
            if (((ulong)plVar12[1] % (ulong)gen_mod_map._M_h._M_buckets !=
                 (ulong)p_Var1 % (ulong)gen_mod_map._M_h._M_buckets) ||
               (plVar8 = plVar16, plVar16 = plVar12, p_Var1 == (_Hash_node_base *)plVar12[1]))
            goto LAB_00213f09;
          }
          plVar8 = (long *)0x0;
        }
LAB_00213f09:
        if ((plVar8 != (long *)0x0) && (*plVar8 != 0)) {
          local_58 = (undefined1  [8])p_Var15->_M_nxt;
          ppMVar7 = std::__detail::
                    _Map_base<kratos::Generator_*,_std::pair<kratos::Generator_*const,_hgdb::json::Module_*>,_std::allocator<std::pair<kratos::Generator_*const,_hgdb::json::Module_*>_>,_std::__detail::_Select1st,_std::equal_to<kratos::Generator_*>,_std::hash<kratos::Generator_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                    ::at((_Map_base<kratos::Generator_*,_std::pair<kratos::Generator_*const,_hgdb::json::Module_*>,_std::allocator<std::pair<kratos::Generator_*const,_hgdb::json::Module_*>_>,_std::__detail::_Select1st,_std::equal_to<kratos::Generator_*>,_std::hash<kratos::Generator_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)local_110,(key_type *)local_58);
          hgdb::json::Module::add_instance(this_01,(string *)(p_Var15->_M_nxt + 0x13),*ppMVar7);
        }
      }
      std::
      vector<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
      ::~vector((vector<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
                 *)__return_storage_ptr__);
      plVar18 = (long *)*plVar18;
    } while (plVar18 != (long *)0x0);
  }
  plVar18 = *(long **)&local_38[4].second;
  if (plVar18 != (long *)0x0) {
    local_a8 = (_Map_base<const_kratos::Generator_*,_std::pair<const_kratos::Generator_*const,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::pair<const_kratos::Generator_*const,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_kratos::Generator_*>,_std::hash<const_kratos::Generator_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                *)&local_38[1].second;
    do {
      local_58 = (undefined1  [8])plVar18[1];
      pcVar19 = local_38[2].first._M_dataplus._M_p;
      uVar14 = (ulong)local_58 % (ulong)pcVar19;
      plVar12 = *(long **)(*(long *)&local_38[1].second + uVar14 * 8);
      plVar8 = (long *)0x0;
      if ((plVar12 != (long *)0x0) &&
         (plVar8 = plVar12, plVar16 = (long *)*plVar12,
         local_58 != (undefined1  [8])((long *)*plVar12)[1])) {
        while (plVar12 = (long *)*plVar16, plVar12 != (long *)0x0) {
          plVar8 = (long *)0x0;
          if (((ulong)plVar12[1] % (ulong)pcVar19 != uVar14) ||
             (plVar8 = plVar16, plVar16 = plVar12, local_58 == (undefined1  [8])plVar12[1]))
          goto LAB_00213ff8;
        }
        plVar8 = (long *)0x0;
      }
LAB_00213ff8:
      local_b0 = plVar18;
      if ((plVar8 != (long *)0x0) && (*plVar8 != 0)) {
        ppMVar7 = std::__detail::
                  _Map_base<kratos::Generator_*,_std::pair<kratos::Generator_*const,_hgdb::json::Module_*>,_std::allocator<std::pair<kratos::Generator_*const,_hgdb::json::Module_*>_>,_std::__detail::_Select1st,_std::equal_to<kratos::Generator_*>,_std::hash<kratos::Generator_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  ::at((_Map_base<kratos::Generator_*,_std::pair<kratos::Generator_*const,_hgdb::json::Module_*>,_std::allocator<std::pair<kratos::Generator_*const,_hgdb::json::Module_*>_>,_std::__detail::_Select1st,_std::equal_to<kratos::Generator_*>,_std::hash<kratos::Generator_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                        *)local_110,(key_type *)local_58);
        visited_gens._M_h._M_single_bucket = (__node_base_ptr)*ppMVar7;
        pmVar9 = std::__detail::
                 _Map_base<const_kratos::Generator_*,_std::pair<const_kratos::Generator_*const,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::pair<const_kratos::Generator_*const,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_kratos::Generator_*>,_std::hash<const_kratos::Generator_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::at(local_a8,(key_type *)local_58);
        p_Var10 = (pmVar9->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
        p_Var13 = &(pmVar9->_M_t)._M_impl.super__Rb_tree_header;
        if ((_Rb_tree_header *)p_Var10 != p_Var13) {
          this_00 = (vector<std::variant<hgdb::json::Variable,_unsigned_long>,_std::allocator<std::variant<hgdb::json::Variable,_unsigned_long>_>_>
                     *)(visited_gens._M_h._M_single_bucket + 0x14);
          local_b8 = &p_Var13->_M_header;
          do {
            Generator::get_var((Generator *)local_98,(string *)local_58);
            if (local_98 == (undefined1  [8])0x0) {
LAB_0021417d:
              add_generator_static_value
                        ((Module *)visited_gens._M_h._M_single_bucket,(string *)(p_Var10 + 1),
                         (string *)(p_Var10 + 2));
            }
            else if (((((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Param>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Param>_>_>_>
                         *)((long)local_98 + 0x160))->_M_t)._M_impl.super__Rb_tree_header._M_header.
                      _M_color & 0xfffffffb) == _S_red) {
              create_variables((vector<std::pair<hgdb::json::Variable,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<hgdb::json::Variable,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)&breakpoint_conditions._M_h._M_single_bucket,(Var *)local_98,
                               (string *)(p_Var10 + 1));
              p_Var4 = (__node_base_ptr)CONCAT44(uStack_3e4,_stream);
              for (p_Var15 = breakpoint_conditions._M_h._M_single_bucket; p_Var15 != p_Var4;
                  p_Var15 = p_Var15 + 0xf) {
                table._128_8_ = local_158;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&table.reorder_,p_Var15->_M_nxt,
                           (long)&p_Var15->_M_nxt->_M_nxt + (long)&(p_Var15[1]._M_nxt)->_M_nxt);
                local_148[0] = &local_138;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)local_148,p_Var15[4]._M_nxt,
                           (long)&(p_Var15[4]._M_nxt)->_M_nxt + (long)&(p_Var15[5]._M_nxt)->_M_nxt);
                local_118 = p_Var15[10]._M_nxt;
                local_128 = p_Var15[8]._M_nxt;
                p_Stack_120 = p_Var15[9]._M_nxt;
                std::
                vector<std::variant<hgdb::json::Variable,_unsigned_long>,_std::allocator<std::variant<hgdb::json::Variable,_unsigned_long>_>_>
                ::emplace_back<hgdb::json::Variable>(this_00,(Variable *)&table.reorder_);
                if (local_148[0] != &local_138) {
                  operator_delete(local_148[0],local_138._M_allocated_capacity + 1);
                }
                if ((long *)table._128_8_ != local_158) {
                  operator_delete((void *)table._128_8_,local_158[0] + 1);
                }
              }
              std::
              vector<std::pair<hgdb::json::Variable,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<hgdb::json::Variable,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::~vector((vector<std::pair<hgdb::json::Variable,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<hgdb::json::Variable,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&breakpoint_conditions._M_h._M_single_bucket);
            }
            else if (local_98 == (undefined1  [8])0x0) goto LAB_0021417d;
            if (visited_gens._M_h._M_buckets != (__buckets_ptr)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                         visited_gens._M_h._M_buckets);
            }
            p_Var10 = (_Base_ptr)std::_Rb_tree_increment(p_Var10);
          } while (p_Var10 != local_b8);
        }
      }
      plVar18 = (long *)*local_b0;
    } while (plVar18 != (long *)0x0);
  }
  local_98 = (undefined1  [8])&visited_gens._M_h._M_rehash_policy._M_next_resize;
  visited_gens._M_h._M_buckets = (__buckets_ptr)0x1;
  visited_gens._M_h._M_bucket_count = 0;
  visited_gens._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  visited_gens._M_h._M_element_count._0_4_ = 0x3f800000;
  visited_gens._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  visited_gens._M_h._M_rehash_policy._4_4_ = 0;
  visited_gens._M_h._M_rehash_policy._M_next_resize = 0;
  pcVar19 = (local_38->first)._M_dataplus._M_p;
  pcVar2 = (pointer)(local_38->first)._M_string_length;
  if (pcVar19 != pcVar2) {
    local_38 = (pointer)((long)&(local_38->first).field_2 + 8);
    do {
      local_58 = (undefined1  [8])Stmt::generator_parent(*(Stmt **)pcVar19);
      if (local_58 != (undefined1  [8])0x0) {
        pp_Var3 = (&((IRNode *)local_98)->_vptr_IRNode)
                  [(ulong)local_58 % (ulong)visited_gens._M_h._M_buckets];
        pp_Var11 = (_func_int **)0x0;
        if ((pp_Var3 != (_func_int **)0x0) &&
           (pp_Var11 = pp_Var3, pp_Var17 = (_func_int **)*pp_Var3,
           local_58 != (undefined1  [8])*(Generator **)((long)*pp_Var3 + 8))) {
          while (pp_Var3 = (_func_int **)*pp_Var17, pp_Var3 != (_func_int **)0x0) {
            pp_Var11 = (_func_int **)0x0;
            if (((ulong)pp_Var3[1] % (ulong)visited_gens._M_h._M_buckets !=
                 (ulong)local_58 % (ulong)visited_gens._M_h._M_buckets) ||
               (pp_Var11 = pp_Var17, pp_Var17 = pp_Var3, local_58 == (undefined1  [8])pp_Var3[1]))
            goto LAB_0021429b;
          }
          pp_Var11 = (_func_int **)0x0;
        }
LAB_0021429b:
        if ((pp_Var11 == (_func_int **)0x0) || (*pp_Var11 == (_func_int *)0x0)) {
          plVar18 = *(long **)((long)local_110 +
                              ((ulong)local_58 % (ulong)gen_mod_map._M_h._M_buckets) * 8);
          plVar12 = (long *)0x0;
          if ((plVar18 != (long *)0x0) &&
             (plVar12 = plVar18, plVar8 = (long *)*plVar18,
             local_58 != (undefined1  [8])((long *)*plVar18)[1])) {
            while (plVar18 = (long *)*plVar8, plVar18 != (long *)0x0) {
              plVar12 = (long *)0x0;
              if (((ulong)plVar18[1] % (ulong)gen_mod_map._M_h._M_buckets !=
                   (ulong)local_58 % (ulong)gen_mod_map._M_h._M_buckets) ||
                 (plVar12 = plVar8, plVar8 = plVar18, local_58 == (undefined1  [8])plVar18[1]))
              goto LAB_0021430a;
            }
            plVar12 = (long *)0x0;
          }
LAB_0021430a:
          if ((plVar12 != (long *)0x0) && (*plVar12 != 0)) {
            std::
            _Hashtable<kratos::Generator*,kratos::Generator*,std::allocator<kratos::Generator*>,std::__detail::_Identity,std::equal_to<kratos::Generator*>,std::hash<kratos::Generator*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
            ::_M_emplace<kratos::Generator*&>
                      ((_Hashtable<kratos::Generator*,kratos::Generator*,std::allocator<kratos::Generator*>,std::__detail::_Identity,std::equal_to<kratos::Generator*>,std::hash<kratos::Generator*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                        *)local_98,local_58);
            ppMVar7 = std::__detail::
                      _Map_base<kratos::Generator_*,_std::pair<kratos::Generator_*const,_hgdb::json::Module_*>,_std::allocator<std::pair<kratos::Generator_*const,_hgdb::json::Module_*>_>,_std::__detail::_Select1st,_std::equal_to<kratos::Generator_*>,_std::hash<kratos::Generator_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                      ::at((_Map_base<kratos::Generator_*,_std::pair<kratos::Generator_*const,_hgdb::json::Module_*>,_std::allocator<std::pair<kratos::Generator_*const,_hgdb::json::Module_*>_>,_std::__detail::_Select1st,_std::equal_to<kratos::Generator_*>,_std::hash<kratos::Generator_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)local_110,(key_type *)local_58);
            local_3a8 = *ppMVar7;
            _stream = 0;
            local_3e0._M_buckets = &local_3e0._M_single_bucket;
            local_3e0._M_bucket_count = 1;
            local_3e0._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
            local_3e0._M_element_count = 0;
            local_3e0._M_rehash_policy._M_max_load_factor = 1.0;
            local_3e0._M_rehash_policy._M_next_resize = 0;
            local_3e0._M_single_bucket = (__node_base_ptr)0x0;
            breakpoint_conditions._M_h._M_single_bucket = (__node_base_ptr)&PTR_visit_root_002b44d8;
            local_3a0 = (Generator *)local_58;
            local_398._M_buckets = &local_398._M_single_bucket;
            local_398._M_bucket_count = 1;
            local_398._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
            local_398._M_element_count = 0;
            local_398._M_rehash_policy._M_max_load_factor = 1.0;
            local_398._M_rehash_policy._M_next_resize = 0;
            local_398._M_single_bucket = (__node_base_ptr)0x0;
            local_360 = local_38;
            local_358 = local_428;
            IRVisitor::visit_content
                      ((IRVisitor *)&breakpoint_conditions._M_h._M_single_bucket,
                       (Generator *)local_58);
            breakpoint_conditions._M_h._M_single_bucket = (__node_base_ptr)&PTR_visit_root_002b44d8;
            std::
            _Hashtable<const_kratos::Stmt_*,_std::pair<const_kratos::Stmt_*const,_hgdb::json::Scope<std::nullptr_t>_*>,_std::allocator<std::pair<const_kratos::Stmt_*const,_hgdb::json::Scope<std::nullptr_t>_*>_>,_std::__detail::_Select1st,_std::equal_to<const_kratos::Stmt_*>,_std::hash<const_kratos::Stmt_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::~_Hashtable(&local_398);
            breakpoint_conditions._M_h._M_single_bucket = (__node_base_ptr)&PTR_visit_root_002adb38;
            std::
            _Hashtable<kratos::IRNode_*,_kratos::IRNode_*,_std::allocator<kratos::IRNode_*>,_std::__detail::_Identity,_std::equal_to<kratos::IRNode_*>,_std::hash<kratos::IRNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::~_Hashtable(&local_3e0);
          }
        }
      }
      pcVar19 = pcVar19 + 8;
    } while (pcVar19 != pcVar2);
  }
  hgdb::json::SymbolTable::compress_var((SymbolTable *)local_1f0);
  puVar5 = table.modules_.
           super__Vector_base<std::unique_ptr<hgdb::json::Module,_std::default_delete<hgdb::json::Module>_>,_std::allocator<std::unique_ptr<hgdb::json::Module,_std::default_delete<hgdb::json::Module>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  breakpoint_conditions._M_h._M_single_bucket = (__node_base_ptr)&PTR_handle_002b4958;
  if ((pointer)table.top_names_._M_t._M_impl.super__Rb_tree_header._M_node_count !=
      table.modules_.
      super__Vector_base<std::unique_ptr<hgdb::json::Module,_std::default_delete<hgdb::json::Module>_>,_std::allocator<std::unique_ptr<hgdb::json::Module,_std::default_delete<hgdb::json::Module>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    puVar20 = (pointer)table.top_names_._M_t._M_impl.super__Rb_tree_header._M_node_count;
    do {
      hgdb::json::SymbolTable::ScopeVisitor::visit
                ((ScopeVisitor *)&breakpoint_conditions._M_h._M_single_bucket,
                 (ScopeBase *)
                 (puVar20->_M_t).
                 super___uniq_ptr_impl<hgdb::json::Module,_std::default_delete<hgdb::json::Module>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_hgdb::json::Module_*,_std::default_delete<hgdb::json::Module>_>
                 .super__Head_base<0UL,_hgdb::json::Module_*,_false>._M_head_impl);
      puVar20 = puVar20 + 1;
    } while (puVar20 != puVar5);
  }
  table.variables_.super__Vector_base<hgdb::json::Variable,_std::allocator<hgdb::json::Variable>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  std::ofstream::ofstream(&breakpoint_conditions._M_h._M_single_bucket);
  std::ofstream::open((string *)&breakpoint_conditions._M_h._M_single_bucket,(_Ios_Openmode)local_a0
                     );
  hgdb::json::SymbolTable::output_abi_cxx11_((string *)local_58,(SymbolTable *)local_1f0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&breakpoint_conditions._M_h._M_single_bucket,(char *)local_58,(long)gen_2);
  if (local_58 != (undefined1  [8])&stack0xffffffffffffffb8) {
    operator_delete((void *)local_58,(ulong)(local_48 + 1));
  }
  std::ofstream::close();
  breakpoint_conditions._M_h._M_single_bucket = _VTT;
  *(undefined8 *)((long)&breakpoint_conditions._M_h._M_single_bucket + (long)_VTT[-3]._M_nxt) =
       _pthread_mutex_unlock;
  std::filebuf::~filebuf((filebuf *)&stream);
  std::ios_base::~ios_base(local_2f8);
  std::
  _Hashtable<kratos::Generator_*,_kratos::Generator_*,_std::allocator<kratos::Generator_*>,_std::__detail::_Identity,_std::equal_to<kratos::Generator_*>,_std::hash<kratos::Generator_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<kratos::Generator_*,_kratos::Generator_*,_std::allocator<kratos::Generator_*>,_std::__detail::_Identity,_std::equal_to<kratos::Generator_*>,_std::hash<kratos::Generator_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)local_98);
  std::
  _Hashtable<kratos::Generator_*,_std::pair<kratos::Generator_*const,_hgdb::json::Module_*>,_std::allocator<std::pair<kratos::Generator_*const,_hgdb::json::Module_*>_>,_std::__detail::_Select1st,_std::equal_to<kratos::Generator_*>,_std::hash<kratos::Generator_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<kratos::Generator_*,_std::pair<kratos::Generator_*const,_hgdb::json::Module_*>,_std::allocator<std::pair<kratos::Generator_*const,_hgdb::json::Module_*>_>,_std::__detail::_Select1st,_std::equal_to<kratos::Generator_*>,_std::hash<kratos::Generator_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)local_110);
  std::vector<hgdb::json::Variable,_std::allocator<hgdb::json::Variable>_>::~vector
            ((vector<hgdb::json::Variable,_std::allocator<hgdb::json::Variable>_> *)
             &table.modules_.
              super__Vector_base<std::unique_ptr<hgdb::json::Module,_std::default_delete<hgdb::json::Module>_>,_std::allocator<std::unique_ptr<hgdb::json::Module,_std::default_delete<hgdb::json::Module>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::unique_ptr<hgdb::json::Module,_std::default_delete<hgdb::json::Module>_>,_std::allocator<std::unique_ptr<hgdb::json::Module,_std::default_delete<hgdb::json::Module>_>_>_>
  ::~vector((vector<std::unique_ptr<hgdb::json::Module,_std::default_delete<hgdb::json::Module>_>,_std::allocator<std::unique_ptr<hgdb::json::Module,_std::default_delete<hgdb::json::Module>_>_>_>
             *)&table.top_names_._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&table.framework_name_.field_2 + 8));
  if (local_1f0 != (undefined1  [8])&table.framework_name_._M_string_length) {
    operator_delete((void *)local_1f0,table.framework_name_._M_string_length + 1);
  }
  std::
  _Hashtable<const_kratos::Stmt_*,_std::pair<const_kratos::Stmt_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_kratos::Stmt_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_kratos::Stmt_*>,_std::hash<const_kratos::Stmt_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<const_kratos::Stmt_*,_std::pair<const_kratos::Stmt_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_kratos::Stmt_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_kratos::Stmt_*>,_std::hash<const_kratos::Stmt_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)local_428);
  return;
}

Assistant:

void DebugDatabase::save_database(const std::string &filename, bool override) {
    if (override) {
        if (fs::exists(filename)) {
            fs::remove(filename);
        }
    }

    // compute breakpoint conditions
    auto breakpoint_conditions = compute_enable_condition(top_);
    auto table = hgdb::json::SymbolTable("kratos");

    std::unordered_map<Generator *, hgdb::json::Module *> gen_mod_map;

    // first pass to create modules
    for (auto *gen : generators_) {
        auto *mod = table.add_module(gen->name);
        gen_mod_map.emplace(gen, mod);
    }
    // second pass to add instances
    for (auto *gen : generators_) {
        auto *mod = gen_mod_map.at(gen);
        auto children = gen->get_child_generators();
        for (auto const &child : children) {
            if (gen_mod_map.find(child.get()) == gen_mod_map.end()) continue;
            auto *child_mod = gen_mod_map.at(child.get());
            mod->add_instance(child->instance_name, child_mod);
        }
    }

    // now add generator variables
    for (auto *gen : generators_) {
        if (variable_mapping_.find(gen) == variable_mapping_.end()) continue;
        auto *mod = gen_mod_map.at(gen);
        auto const &var_names = variable_mapping_.at(gen);
        for (auto const &[front_name, back_name] : var_names) {
            auto var = gen->get_var(back_name);
            if (var && (var->type() == VarType::Base || var->type() == VarType::PortIO)) {
                auto vars = create_variables(var.get(), front_name);
                for (auto const &v : vars) {
                    mod->add_variable(v.first);
                }
            } else if (!var) {
                add_generator_static_value(*mod, front_name, back_name);
            }
        }
    }

    // now deal with scopes
    std::unordered_set<Generator *> visited_gens;
    for (auto const *stmt : break_points_) {
        auto *gen = stmt->generator_parent();
        if (!gen || visited_gens.find(gen) != visited_gens.end()) continue;
        if (gen_mod_map.find(gen) == gen_mod_map.end()) continue;
        visited_gens.emplace(gen);
        auto *mod = gen_mod_map.at(gen);
        StmtScopeVisitor v(*mod, gen, stmt_mapping_, breakpoint_conditions);
        v.visit_content(gen);
    }

    // compress the table
    table.compress();

    // setting attributes
    table.disable_reorder();

    std::ofstream stream;
    stream.open(filename);
    stream << table.output();
    stream.close();
}